

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

string * __thiscall
Catch::TestCaseInfo::tagsAsString_abi_cxx11_(string *__return_storage_ptr__,TestCaseInfo *this)

{
  pointer pbVar1;
  const_iterator __begin1;
  const_iterator __end1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tag_1;
  pointer pbVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (pbVar2 = (this->tags).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (this->tags).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar2; pbVar2 = pbVar2 + 1) {
  }
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pbVar1 = (this->tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->tags).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(pbVar2->_M_dataplus)._M_p);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseInfo::tagsAsString() const {
        std::string ret;
        // '[' and ']' per tag
        std::size_t full_size = 2 * tags.size();
        for (const auto& tag : tags) {
            full_size += tag.size();
        }
        ret.reserve(full_size);
        for (const auto& tag : tags) {
            ret.push_back('[');
            ret.append(tag);
            ret.push_back(']');
        }

        return ret;
    }